

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::PumpResponseService::request
          (PumpResponseService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  Promise<void> PVar1;
  undefined8 local_58 [2];
  Type local_48;
  AsyncInputStream *local_38;
  HttpHeaders *headers_local;
  undefined8 uStack_28;
  HttpMethod method_local;
  PumpResponseService *this_local;
  StringPtr url_local;
  
  this_local = (PumpResponseService *)url.content.size_;
  headers_local._4_4_ = url.content.ptr._0_4_;
  local_38 = requestBody;
  uStack_28 = CONCAT44(in_register_00000034,method);
  url_local.content.ptr = (char *)headers;
  url_local.content.size_ = (size_t)this;
  MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  AsyncInputStream::readAllBytes((AsyncInputStream *)&local_48,(uint64_t)response);
  local_58[0] = CONCAT44(in_register_00000034,method);
  Promise<kj::Array<unsigned_char>>::
  then<kj::(anonymous_namespace)::PumpResponseService::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::AsyncInputStream&,kj::HttpService::Response&)::_lambda(kj::Array<unsigned_char>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Array<unsigned_char>> *)this,&local_48,(PropagateException *)local_58);
  Promise<kj::Array<unsigned_char>_>::~Promise((Promise<kj::Array<unsigned_char>_> *)&local_48);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      kj::StringPtr text = "Hello, World!";
      auto body = response.send(200, "OK", headers, text.size());

      auto stream = kj::heap<SimpleInputStream>(text);
      auto promise = stream->pumpTo(*body);
      return promise.attach(kj::mv(body), kj::mv(stream))
          .then([text](uint64_t amount) {
        KJ_EXPECT(amount == text.size());
      });
    });
  }